

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void XPMP2::_NetwGetLocalAddresses(bool bForceRefresh)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  byte in_DIL;
  pair<std::_Rb_tree_const_iterator<XPMP2::LocalIntfAddrTy>,_bool> pVar4;
  ifaddrs *ifa;
  ifaddrs *ifaddr;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff68;
  sockaddr **in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<XPMP2::LocalIntfAddrTy> in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  char *in_stack_ffffffffffffff88;
  undefined8 *puVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 *local_38 [2];
  undefined4 in_stack_ffffffffffffffd8;
  int iVar7;
  NetRuntimeError *in_stack_ffffffffffffffe0;
  byte local_1;
  
  local_1 = in_DIL & 1;
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            (in_stack_ffffffffffffff58,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  iVar7 = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffe0,
             (int *)&stack0xffffffffffffffdc);
  bVar1 = std::chrono::operator>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_1 = 1;
  }
  bVar1 = std::
          set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
          ::empty((set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
                   *)0x34eddb);
  if ((bVar1) || (local_1 != 0)) {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    if (local_1 != 0) {
      std::
      set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
      ::clear((set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
               *)0x34ee18);
    }
    local_38[0] = (undefined8 *)0x0;
    iVar2 = getifaddrs(local_38);
    puVar5 = local_38[0];
    if (iVar2 == -1) {
      uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
      uVar3 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,uVar6),in_stack_ffffffffffffff88,
                 (allocator<char> *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
      NetRuntimeError::NetRuntimeError
                (in_stack_ffffffffffffffe0,(string *)CONCAT44(iVar7,in_stack_ffffffffffffffd8));
      __cxa_throw(uVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    for (; puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
      if (((puVar5[3] != 0) && ((*(uint *)(puVar5 + 2) & 0x41) == 0x41)) &&
         ((*(short *)puVar5[3] == 2 || (*(short *)puVar5[3] == 10)))) {
        pVar4 = std::
                set<XPMP2::LocalIntfAddrTy,std::less<XPMP2::LocalIntfAddrTy>,std::allocator<XPMP2::LocalIntfAddrTy>>
                ::emplace<char*&,sockaddr*&,unsigned_int&>
                          ((set<XPMP2::LocalIntfAddrTy,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
                            *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
                           (char **)in_stack_ffffffffffffff78._M_node,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff78 = pVar4.first._M_node;
        in_stack_ffffffffffffff80 = pVar4.second;
      }
    }
    freeifaddrs(local_38[0]);
    _NetwGetLocalAddresses::tpLastRefresh.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x34efe1)
    ;
  }
  return;
}

Assistant:

void _NetwGetLocalAddresses (bool bForceRefresh = false)
{
    // Every once in a while we enforce the refresh
    static std::chrono::time_point<std::chrono::steady_clock> tpLastRefresh;
    if (std::chrono::steady_clock::now() - tpLastRefresh > std::chrono::seconds(30))
        bForceRefresh = true;
    
    // Quick exit
    if (!gAddrLocal.empty() && !bForceRefresh)
        return;
        
    std::lock_guard<std::recursive_mutex> lock(mtxAddrLocal);
    if (bForceRefresh)
        gAddrLocal.clear();
    
#if IBM
    // Fetch all local interface addresses
    ULONG ret = NO_ERROR;
    ULONG bufLen = 15000;
    std::unique_ptr<IP_ADAPTER_ADDRESSES, decltype(&free)> pAddresses(nullptr, &free);
    do {
        // allocate a return buffer
        pAddresses.reset((IP_ADAPTER_ADDRESSES*)malloc(bufLen));
        if (!pAddresses) {
            LOG_MSG(logERR, "malloc failed for %lu bytes", bufLen);
            return;
        }
        // try fetching all local addresses
        ret = GetAdaptersAddresses(AF_UNSPEC, 0, NULL, pAddresses.get(), &bufLen);
        switch (ret) {
        case ERROR_NO_DATA:                 // no addresses found (?)
            return;
        case ERROR_BUFFER_OVERFLOW:         // buffer too small, but bufLen has the required size now, try again
            break;
        case NO_ERROR:                      // success
            break;
        default:
            LOG_MSG(logERR, "GetAdaptersAddresses failed with error: %ld", ret);
            return;
        }
    } while (ret == ERROR_BUFFER_OVERFLOW);

    // Walk the list of addresses and add to our own vector
    for (const IP_ADAPTER_ADDRESSES* pAddr = pAddresses.get();
         pAddr;
         pAddr = pAddr->Next)
    {
        // Only interested in IPv4/6 enabled, operative interfaces
        if (!pAddr->Ipv4Enabled && !pAddr->Ipv6Enabled)
            continue;
        if (pAddr->OperStatus != IfOperStatusUp)
            continue;

        // Convert the friendly name from wchar to char
        char ifName[26] = { 0 };                                        // zero init and passing in sizeof-1 guarantees zero-termination
        std::wcstombs(ifName, pAddr->FriendlyName, sizeof(ifName)-1);
        
        // Compiler some flags in Unix style
        uint32_t flags = IFF_UP | IFF_BROADCAST;                        // We just _assume_ it's broadcast-enabled...can't find a flag here that would tell us
        if (!pAddr->NoMulticast) flags |= IFF_MULTICAST;
        if (pAddr->IfType == IF_TYPE_SOFTWARE_LOOPBACK) flags |= IFF_LOOPBACK;
            
        // Walk the list of unicast addresses
        for (const IP_ADAPTER_UNICAST_ADDRESS* pUni = pAddr->FirstUnicastAddress;
             pUni;
             pUni = pUni->Next)
        {
            const sockaddr* pSAddr = pUni->Address.lpSockaddr;
            if (!pSAddr) continue;

            gAddrLocal.emplace(
                ifName,
                uint32_t(pSAddr->sa_family == AF_INET6 ? pAddr->Ipv6IfIndex : pAddr->IfIndex),
                pSAddr,
                flags);
        }
    }
#else
    // Fetch all local interface addresses
    struct ifaddrs *ifaddr = nullptr;
    if (getifaddrs(&ifaddr) == -1)
        throw NetRuntimeError("getifaddrs failed");

    // add valid addresses to our local cache array
    for (struct ifaddrs *ifa = ifaddr; ifa != NULL; ifa = ifa->ifa_next) {
        // ignore empty addresses and everything that is not IP
        if (ifa->ifa_addr == NULL)
            continue;
        
        // We are only interested in up&running interfaces
        if ((ifa->ifa_flags & (IFF_UP | IFF_RUNNING)) != (IFF_UP | IFF_RUNNING))
            continue;
        // We are interested in IPv4 and IPv6 interfaces only
        if (ifa->ifa_addr->sa_family != AF_INET &&
            ifa->ifa_addr->sa_family != AF_INET6)
            continue;

        // the others add to our list of local addresses
        gAddrLocal.emplace(ifa->ifa_name,
                           ifa->ifa_addr,
                           ifa->ifa_flags);
    }
    
    // free the return list
    freeifaddrs(ifaddr);
#endif
    
    // Next refresh may waitr
    tpLastRefresh = std::chrono::steady_clock::now();
}